

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_udp.cpp
# Opt level: O0

string * __thiscall miniros::TransportUDP::getTransportInfo_abi_cxx11_(TransportUDP *this)

{
  ostream *poVar1;
  long in_RSI;
  string *in_RDI;
  stringstream str;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"UDPROS connection on port ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0xf0));
  poVar1 = std::operator<<(poVar1," to [");
  poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 0xf8));
  std::operator<<(poVar1,"]");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string TransportUDP::getTransportInfo()
{
  std::stringstream str;
  str << "UDPROS connection on port " << local_port_ << " to [" << cached_remote_host_ << "]";
  return str.str();
}